

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O2

void __thiscall
hiberlite::ExtractModel::putColumn<hiberlite::AVisitor<hiberlite::ExtractModel>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,string *storage)

{
  Scope scope;
  string local_c0;
  string local_a0;
  string local_80;
  undefined1 local_60 [72];
  
  Scope::Scope((Scope *)local_60,&av->scope);
  std::__cxx11::string::string((string *)&local_80,(string *)local_60);
  std::__cxx11::string::string((string *)&local_a0,(string *)(local_60 + 0x20));
  std::__cxx11::string::string((string *)&local_c0,(string *)storage);
  putNamedColumn(this,&local_80,&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  Scope::~Scope((Scope *)local_60);
  return;
}

Assistant:

inline void putColumn(AV& av, std::string storage)
		{
			Scope scope=av.getScope();
			putNamedColumn(scope.table(), scope.prefix(), storage);
		}